

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,Clause **r)

{
  uint uVar1;
  uint uVar2;
  BoolView *pBVar3;
  ulong uVar4;
  size_t __size;
  ulong uVar5;
  vec<Lit> ps;
  vector<bool,_std::allocator<bool>_> red;
  Clause *c;
  vector<bool,_std::allocator<bool>_> v;
  allocator_type local_99;
  vec<Lit> local_98;
  vector<bool,_std::allocator<bool>_> local_80;
  Clause *local_58;
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_98.sz = 0;
  local_98.cap = 0;
  local_98.data = (Lit *)0x0;
  vec<Lit>::push(&local_98);
  uVar1 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,
                (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2);
  vec<Lit>::push(&local_98,(Lit *)&local_80);
  pBVar3 = (this->super_GraphPropagator).vs.data;
  if ((sat.assigns.data[(uint)pBVar3[(uint)u].v] != '\0') &&
     ((uint)pBVar3[(uint)u].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar3[(uint)u].v])) {
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                  (uint)((int)sat.assigns.data[(uint)pBVar3[(uint)u].v] - 1U < 0xfffffffd) +
                  pBVar3[(uint)u].v * 2);
    vec<Lit>::push(&local_98,(Lit *)&local_80);
  }
  local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_50,
             (allocator_type *)&local_58);
  reverseDFS(this,u,&local_80,dom);
  local_58 = (Clause *)((ulong)local_58 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_58,&local_99);
  reverseDFStoBorder(this,u,&local_50,&local_80,&local_98,dom);
  uVar1 = local_98.sz;
  uVar5 = local_98._0_8_ & 0xffffffff;
  __size = 8;
  if (local_98.sz != 0) {
    __size = (ulong)(local_98.sz - 1) * 4 + 8;
  }
  local_58 = (Clause *)malloc(__size);
  uVar2 = *(uint *)local_58;
  local_58->data[0].x = -2;
  *(uint *)local_58 = uVar2 & 0xfc | uVar1 << 8;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      local_58->data[uVar4].x = local_98.data[uVar4].x;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  *(byte *)local_58 = *(byte *)local_58 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_58);
  *r = local_58;
  if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_98.data != (Lit *)0x0) {
    free(local_98.data);
  }
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, Clause** r) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	vec<Lit> ps;
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
	*r = Reason_new(ps);
}